

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementTetraCorot_4::ComputeNF(ChElementTetraCorot_4 *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeNF((ChElementTetraCorot_4 *)
            (this[-1].mM.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
             m_data.array + 5),in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChElementTetraCorot_4::ComputeNF(const double U,
                                      const double V,
                                      const double W,
                                      ChVectorDynamic<>& Qi,
                                      double& detJ,
                                      const ChVectorDynamic<>& F,
                                      ChVectorDynamic<>* state_x,
                                      ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependent on state
    // note: U,V,W in 0..1 range, thanks to IsTetrahedronIntegrationNeeded() {return true;}
    ShapeVector N;
    this->ShapeFunctions(N, U, V, W);

    detJ = 6 * this->GetVolume();

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
}